

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VectorErrorMsg(Parse *pParse,Expr *pExpr)

{
  if ((pExpr->flags & 0x800) == 0) {
    sqlite3ErrorMsg(pParse,"row value misused");
    return;
  }
  sqlite3SubselectError(pParse,((pExpr->x).pSelect)->pEList->nExpr,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VectorErrorMsg(Parse *pParse, Expr *pExpr){
#ifndef SQLITE_OMIT_SUBQUERY
  if( pExpr->flags & EP_xIsSelect ){
    sqlite3SubselectError(pParse, pExpr->x.pSelect->pEList->nExpr, 1);
  }else
#endif
  {
    sqlite3ErrorMsg(pParse, "row value misused");
  }
}